

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_ec_asn1.cc
# Opt level: O2

int eckey_pub_decode(EVP_PKEY *out,CBS *params,CBS *key)

{
  int iVar1;
  EC_GROUP *group;
  tuple<ec_key_st_*,_bssl::internal::Deleter> key_00;
  int iVar2;
  pointer __p;
  UniquePtr<EC_KEY> eckey;
  
  group = EC_KEY_parse_curve_name(params);
  if ((group == (EC_GROUP *)0x0) || (params->len != 0)) {
    iVar2 = 0;
    ERR_put_error(6,0,0x66,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_ec_asn1.cc"
                  ,0x39);
  }
  else {
    key_00.super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>)EC_KEY_new();
    iVar2 = 0;
    eckey._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<ec_key_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<ec_key_st,_bssl::internal::Deleter,_true,_true>)
         key_00.super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl;
    if (key_00.super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl !=
        (_Head_base<0UL,_ec_key_st_*,_false>)0x0) {
      iVar1 = EC_KEY_set_group((EC_KEY *)
                               key_00.super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl,
                               (EC_GROUP *)group);
      if (iVar1 != 0) {
        iVar2 = 0;
        iVar1 = EC_KEY_oct2key((EC_KEY *)
                               key_00.super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl,key->data,
                               key->len,(BN_CTX *)0x0);
        if (iVar1 != 0) {
          eckey._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl =
               (__uniq_ptr_data<ec_key_st,_bssl::internal::Deleter,_true,_true>)
               (__uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>)0x0;
          EVP_PKEY_assign_EC_KEY
                    (out,(EC_KEY *)
                         key_00.super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl);
          iVar2 = 1;
        }
      }
    }
    std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::~unique_ptr(&eckey);
  }
  return iVar2;
}

Assistant:

static int eckey_pub_decode(EVP_PKEY *out, CBS *params, CBS *key) {
  // See RFC 5480, section 2.

  // The parameters are a named curve.
  const EC_GROUP *group = EC_KEY_parse_curve_name(params);
  if (group == NULL || CBS_len(params) != 0) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_DECODE_ERROR);
    return 0;
  }

  bssl::UniquePtr<EC_KEY> eckey(EC_KEY_new());
  if (eckey == nullptr ||  //
      !EC_KEY_set_group(eckey.get(), group) ||
      !EC_KEY_oct2key(eckey.get(), CBS_data(key), CBS_len(key), nullptr)) {
    return 0;
  }

  EVP_PKEY_assign_EC_KEY(out, eckey.release());
  return 1;
}